

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void do_while_statement(ch_compilation *comp)

{
  ch_jmpptr cVar1;
  undefined4 local_20;
  byte local_19;
  ch_op op;
  uint8_t exit_jump;
  ch_jmpptr loop_jump;
  uint8_t scope_mark;
  ch_compilation *comp_local;
  
  _loop_jump = comp;
  consume(comp,TK_DO,"Expected do while statement",(ch_token *)0x0);
  exit_jump = begin_scope(_loop_jump);
  op = record_loop(_loop_jump);
  scope(_loop_jump);
  end_scope(_loop_jump,exit_jump);
  consume(_loop_jump,TK_WHILE,"Expected while keyword",(ch_token *)0x0);
  consume(_loop_jump,TK_POPEN,"Expected opening parenthesis",(ch_token *)0x0);
  expression(_loop_jump);
  cVar1 = emit_jump(_loop_jump,OP_JMP_FALSE);
  local_19 = (byte)cVar1;
  local_20 = 1;
  ch_emit_write(&((_loop_jump->emit).emit_scope)->bytecode,&local_20,1);
  emit_loop(_loop_jump,op);
  patch_jump(_loop_jump,(uint)local_19);
  consume(_loop_jump,TK_PCLOSE,"Expected closing parenthesis",(ch_token *)0x0);
  return;
}

Assistant:

void do_while_statement(ch_compilation* comp) {
  consume(comp, TK_DO, "Expected do while statement", NULL);
  uint8_t scope_mark = begin_scope(comp);
  ch_jmpptr loop_jump = record_loop(comp);
  scope(comp);
  end_scope(comp, scope_mark);

  consume(comp, TK_WHILE, "Expected while keyword", NULL);
  consume(comp, TK_POPEN, "Expected opening parenthesis", NULL);
  expression(comp);
  uint8_t exit_jump = emit_jump(comp, OP_JMP_FALSE);
  EMIT_OP(GET_EMIT(comp), OP_POP);
  emit_loop(comp, loop_jump);
  patch_jump(comp, exit_jump);

  consume(comp, TK_PCLOSE, "Expected closing parenthesis", NULL);
}